

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

int64_t cab_consume_cfdata(archive_read *a,int64_t consumed_bytes)

{
  bool bVar1;
  wchar_t wVar2;
  ulong uVar3;
  int64_t iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  ssize_t avail;
  ulong local_40;
  void *local_38;
  
  pvVar9 = a->format->data;
  uVar3 = cab_minimum_consume_cfdata(a,consumed_bytes);
  if ((long)uVar3 < 0) {
LAB_00140bbf:
    consumed_bytes = -0x1e;
  }
  else if (uVar3 != 0) {
    lVar5 = *(long *)((long)pvVar9 + 0x38);
    local_38 = pvVar9;
    do {
      if ((ulong)*(ushort *)(lVar5 + 4) == 0) {
        archive_set_error(&a->archive,0x54,"Invalid CFDATA");
        goto LAB_00140bbf;
      }
      uVar8 = (ulong)*(ushort *)(lVar5 + 10);
      uVar6 = uVar8;
      if (uVar3 < uVar8) {
        uVar6 = uVar3;
      }
      if ((*(short *)(lVar5 + 0xc) == 0) &&
         ((*(ushort *)(*(long *)((long)pvVar9 + 0x30) + 0x10) | 2) == 0xffff)) {
        if (uVar3 < uVar8) {
          *(short *)(lVar5 + 0xe) = *(short *)(lVar5 + 0xe) + (short)uVar6;
          *(ushort *)(lVar5 + 10) = *(ushort *)(lVar5 + 10) - (short)uVar6;
          return consumed_bytes;
        }
        __archive_read_consume(a,(ulong)*(ushort *)(lVar5 + 4));
        *(long *)((long)pvVar9 + 0x40) =
             *(long *)((long)pvVar9 + 0x40) + (ulong)*(ushort *)(lVar5 + 4);
        *(undefined2 *)(lVar5 + 6) = 0;
        *(undefined2 *)(lVar5 + 10) = 0;
        wVar2 = cab_next_cfdata(a);
        if (wVar2 < L'\0') {
LAB_00140bd8:
          return (long)wVar2;
        }
        lVar5 = *(long *)((long)pvVar9 + 0x38);
        if ((*(short *)(lVar5 + 8) == 0) &&
           (0xfffc < *(ushort *)(*(long *)((long)pvVar9 + 0x30) + 0x10))) {
          return consumed_bytes;
        }
      }
      else {
        uVar7 = uVar6;
        if (uVar8 == 0) {
          wVar2 = cab_next_cfdata(a);
          if (wVar2 < L'\0') goto LAB_00140bd8;
          lVar5 = *(long *)((long)local_38 + 0x38);
          pvVar9 = local_38;
          if ((*(short *)(lVar5 + 8) == 0) &&
             (0xfffc < *(ushort *)(*(long *)((long)local_38 + 0x30) + 0x10))) goto LAB_00140bbf;
        }
        else {
          do {
            cab_read_ahead_cfdata(a,(ssize_t *)&local_40);
            if ((long)local_40 < 1) {
              return -0x1e;
            }
            if (uVar7 < local_40) {
              local_40 = uVar7;
            }
            iVar4 = cab_minimum_consume_cfdata(a,local_40);
            if (iVar4 < 0) {
              return -0x1e;
            }
            uVar8 = uVar7 - local_40;
            bVar1 = (long)local_40 <= (long)uVar7;
            pvVar9 = local_38;
            uVar7 = uVar8;
          } while (uVar8 != 0 && bVar1);
        }
      }
      uVar3 = uVar3 - uVar6;
    } while (0 < (long)uVar3);
  }
  return consumed_bytes;
}

Assistant:

static int64_t
cab_consume_cfdata(struct archive_read *a, int64_t consumed_bytes)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata;
	int64_t cbytes, rbytes;
	int err;

	rbytes = cab_minimum_consume_cfdata(a, consumed_bytes);
	if (rbytes < 0)
		return (ARCHIVE_FATAL);

	cfdata = cab->entry_cfdata;
	while (rbytes > 0) {
		ssize_t avail;

		if (cfdata->compressed_size == 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Invalid CFDATA");
			return (ARCHIVE_FATAL);
		}
		cbytes = cfdata->uncompressed_bytes_remaining;
		if (cbytes > rbytes)
			cbytes = rbytes;
		rbytes -= cbytes;

		if (cfdata->uncompressed_avail == 0 &&
		   (cab->entry_cffile->folder == iFoldCONTINUED_PREV_AND_NEXT ||
		    cab->entry_cffile->folder == iFoldCONTINUED_FROM_PREV)) {
			/* We have not read any data yet. */
			if (cbytes == cfdata->uncompressed_bytes_remaining) {
				/* Skip whole current CFDATA. */
				__archive_read_consume(a,
				    cfdata->compressed_size);
				cab->cab_offset += cfdata->compressed_size;
				cfdata->compressed_bytes_remaining = 0;
				cfdata->uncompressed_bytes_remaining = 0;
				err = cab_next_cfdata(a);
				if (err < 0)
					return (err);
				cfdata = cab->entry_cfdata;
				if (cfdata->uncompressed_size == 0) {
					switch (cab->entry_cffile->folder) {
					case iFoldCONTINUED_PREV_AND_NEXT:
					case iFoldCONTINUED_TO_NEXT:
					case iFoldCONTINUED_FROM_PREV:
						rbytes = 0;
						break;
					default:
						break;
					}
				}
				continue;
			}
			cfdata->read_offset += (uint16_t)cbytes;
			cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
			break;
		} else if (cbytes == 0) {
			err = cab_next_cfdata(a);
			if (err < 0)
				return (err);
			cfdata = cab->entry_cfdata;
			if (cfdata->uncompressed_size == 0) {
				switch (cab->entry_cffile->folder) {
				case iFoldCONTINUED_PREV_AND_NEXT:
				case iFoldCONTINUED_TO_NEXT:
				case iFoldCONTINUED_FROM_PREV:
					return (ARCHIVE_FATAL);
				default:
					break;
				}
			}
			continue;
		}
		while (cbytes > 0) {
			(void)cab_read_ahead_cfdata(a, &avail);
			if (avail <= 0)
				return (ARCHIVE_FATAL);
			if (avail > cbytes)
				avail = (ssize_t)cbytes;
			if (cab_minimum_consume_cfdata(a, avail) < 0)
				return (ARCHIVE_FATAL);
			cbytes -= avail;
		}
	}
	return (consumed_bytes);
}